

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O0

EElementSemantic Assimp::PLY::Element::ParseSemantic(vector<char,_std::allocator<char>_> *buffer)

{
  bool bVar1;
  EElementSemantic local_14;
  EElementSemantic eOut;
  vector<char,_std::allocator<char>_> *buffer_local;
  
  bVar1 = std::vector<char,_std::allocator<char>_>::empty(buffer);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_14 = EEST_INVALID;
    bVar1 = DOM::TokenMatch(buffer,"vertex",6);
    if (bVar1) {
      local_14 = EEST_Vertex;
    }
    else {
      bVar1 = DOM::TokenMatch(buffer,"face",4);
      if (bVar1) {
        local_14 = EEST_Face;
      }
      else {
        bVar1 = DOM::TokenMatch(buffer,"tristrips",9);
        if (bVar1) {
          local_14 = EEST_TriStrip;
        }
        else {
          bVar1 = DOM::TokenMatch(buffer,"edge",4);
          if (bVar1) {
            local_14 = EEST_Edge;
          }
          else {
            bVar1 = DOM::TokenMatch(buffer,"material",8);
            if (bVar1) {
              local_14 = EEST_Material;
            }
            else {
              bVar1 = DOM::TokenMatch(buffer,"TextureFile",0xb);
              if (bVar1) {
                local_14 = EEST_TextureFile;
              }
            }
          }
        }
      }
    }
    return local_14;
  }
  __assert_fail("!buffer.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Ply/PlyParser.cpp"
                ,0x135,
                "static PLY::EElementSemantic Assimp::PLY::Element::ParseSemantic(std::vector<char> &)"
               );
}

Assistant:

PLY::EElementSemantic PLY::Element::ParseSemantic(std::vector<char> &buffer)
{
  ai_assert(!buffer.empty());

  PLY::EElementSemantic eOut = PLY::EEST_INVALID;
  if (PLY::DOM::TokenMatch(buffer, "vertex", 6))
  {
    eOut = PLY::EEST_Vertex;
  }
  else if (PLY::DOM::TokenMatch(buffer, "face", 4))
  {
    eOut = PLY::EEST_Face;
  }
  else if (PLY::DOM::TokenMatch(buffer, "tristrips", 9))
  {
    eOut = PLY::EEST_TriStrip;
  }
#if 0
  // TODO: maybe implement this?
  else if (PLY::DOM::TokenMatch(buffer,"range_grid",10))
  {
    eOut = PLY::EEST_Face;
  }
#endif
  else if (PLY::DOM::TokenMatch(buffer, "edge", 4))
  {
    eOut = PLY::EEST_Edge;
  }
  else if (PLY::DOM::TokenMatch(buffer, "material", 8))
  {
    eOut = PLY::EEST_Material;
  }
  else if (PLY::DOM::TokenMatch(buffer, "TextureFile", 11))
  {
    eOut = PLY::EEST_TextureFile;
  }

  return eOut;
}